

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O1

int falsecolor(int argc,char **argv)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pIVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  Allocator AVar8;
  Image *pIVar9;
  float afVar10 [2];
  int iVar11;
  size_type sVar12;
  size_t sVar13;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  long *plVar17;
  Point2i PVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  Float FVar21;
  aligned_storage_t<sizeof(float),_alignof(float)> aVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar26 [64];
  undefined1 in_XMM3 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_float> values;
  bool plusMinus;
  Float maxValue;
  string outFile;
  string inFile;
  ImageAndMetadata im;
  Image outImage;
  bool local_595;
  float local_594;
  char **local_590;
  undefined1 local_588 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  long local_550;
  string local_548;
  string local_528;
  string local_508;
  undefined1 local_4e8 [16];
  _Any_data local_4d8;
  code *local_4c8;
  code *local_4c0;
  _Any_data local_4b8;
  code *local_4a8;
  code *local_4a0;
  _Any_data local_498;
  code *local_488;
  code *local_480;
  undefined1 local_478 [8];
  float afStack_470 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_468;
  string asStack_458 [16];
  undefined8 auStack_448 [2];
  string local_438 [8];
  ulong uStack_430;
  long alStack_428 [7];
  undefined1 auStack_3f0 [8];
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> aStack_3e8;
  ulong uStack_3d8;
  undefined1 auStack_3d0 [8];
  optional<int> oStack_3c8;
  optional<float> oStack_3c0;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_3b8;
  ulong uStack_3b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  _Stack_3a8;
  ColorEncodingHandle local_370;
  ColorEncodingHandle local_368;
  undefined1 local_360 [16];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_350;
  polymorphic_allocator<unsigned_char> local_2a8;
  uchar *local_2a0;
  size_t local_298;
  size_t local_290;
  polymorphic_allocator<pbrt::Half> local_288;
  Half *local_280;
  size_t local_278;
  size_t local_270;
  polymorphic_allocator<float> local_268;
  float *local_260;
  size_t local_258;
  size_t local_250;
  bool local_244;
  bool local_200;
  bool local_1bc;
  bool local_1a8;
  bool local_19c;
  bool local_194;
  bool local_18c;
  bool local_180;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_178;
  long *local_148;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_140;
  anon_union_128_1_a7e8d694_for_InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_5
  local_128;
  polymorphic_allocator<unsigned_char> local_90;
  uchar *local_88;
  size_t local_80;
  size_t local_78;
  polymorphic_allocator<pbrt::Half> local_70;
  Half *local_68;
  size_t local_60;
  size_t local_58;
  polymorphic_allocator<float> local_50;
  float *local_48;
  size_t local_40;
  size_t local_38;
  
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  local_570._M_string_length = 0;
  local_570.field_2._M_local_buf[0] = '\0';
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  local_548._M_string_length = 0;
  local_548.field_2._M_local_buf[0] = '\0';
  local_595 = false;
  local_594 = -INFINITY;
  local_590 = argv;
  if (*argv != (char *)0x0) {
    local_588._0_8_ = &local_528.field_2;
    do {
      local_360._0_8_ = &local_350;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"outfile","");
      local_498._M_unused._M_object = (void *)0x0;
      local_498._8_8_ = 0;
      local_480 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1175:24)>
                  ::_M_invoke;
      local_488 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1175:24)>
                  ::_M_manager;
      bVar5 = pbrt::ParseArg<std::__cxx11::string*>
                        (&local_590,(string *)local_360,&local_570,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)&local_498);
      bVar6 = true;
      if (bVar5) {
        bVar3 = false;
      }
      else {
        local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"plusminus","");
        local_4b8._M_unused._M_object = (void *)0x0;
        local_4b8._8_8_ = 0;
        local_4a0 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1175:24)>
                    ::_M_invoke;
        local_4a8 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1175:24)>
                    ::_M_manager;
        bVar6 = pbrt::ParseArg<bool*>
                          (&local_590,&local_528,&local_595,
                           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                            *)&local_4b8);
        if (bVar6) {
          bVar3 = false;
          bVar6 = true;
        }
        else {
          local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"maxValue","");
          local_4d8._M_unused._M_object = (void *)0x0;
          local_4d8._8_8_ = 0;
          local_4c0 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1175:24)>
                      ::_M_invoke;
          local_4c8 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1175:24)>
                      ::_M_manager;
          bVar6 = pbrt::ParseArg<float*>
                            (&local_590,&local_508,&local_594,
                             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                              *)&local_4d8);
          bVar3 = true;
        }
      }
      if (bVar3) {
        if (local_4c8 != (code *)0x0) {
          (*local_4c8)(&local_4d8,&local_4d8,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p != &local_508.field_2) {
          operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
        }
      }
      if (!bVar5) {
        if (local_4a8 != (code *)0x0) {
          (*local_4a8)(&local_4b8,&local_4b8,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._M_dataplus._M_p != &local_528.field_2) {
          operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_488 != (code *)0x0) {
        (*local_488)(&local_498,&local_498,__destroy_functor);
      }
      if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_360._0_8_ != &local_350) {
        operator_delete((void *)local_360._0_8_,(long)local_350.alloc.memoryResource + 1);
      }
      if (bVar6 == false) {
        if ((local_548._M_string_length != 0) || (pcVar14 = *local_590, *pcVar14 == '-')) {
          usage("falsecolor","%s: unknown command flag",*local_590);
        }
        strlen(pcVar14);
        std::__cxx11::string::_M_replace((ulong)&local_548,0,(char *)0x0,(ulong)pcVar14);
        local_590 = local_590 + 1;
      }
    } while (*local_590 != (char *)0x0);
  }
  if (local_548._M_string_length == 0) {
    pcVar14 = "expecting input image filename.";
  }
  else {
    if (local_570._M_string_length != 0) {
      AVar8.memoryResource = pstd::pmr::new_delete_resource();
      local_368.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )0;
      pbrt::Image::Read((ImageAndMetadata *)local_360,&local_548,AVar8,&local_368);
      pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_360._0_8_;
      if ((local_594 <= -INFINITY) && (0 < (int)local_360._8_4_)) {
        lVar16 = 0;
        do {
          local_360._4_4_ = (undefined4)((ulong)pIVar4 >> 0x20);
          if (0 < (int)local_360._4_4_) {
            uVar15 = 0;
            local_360._0_8_ = pIVar4;
            do {
              pbrt::Image::GetChannels
                        ((ImageChannelValues *)&local_148,(Image *)local_360,
                         (Point2i)(lVar16 << 0x20 | uVar15),(WrapMode2D)0x200000002);
              if (local_128.fixed[0]._M_string_length == 0) {
                auVar20 = SUB6416(ZEXT864(0),0);
              }
              else {
                pIVar9 = (Image *)local_140;
                if (local_140 ==
                    (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x0) {
                  pIVar9 = (Image *)&stack0xfffffffffffffec8;
                }
                fVar23 = 0.0;
                sVar12 = 0;
                do {
                  fVar23 = fVar23 + *(float *)((long)&(((
                                                  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)pIVar9)->alloc).memoryResource + sVar12 * 4);
                  auVar20 = ZEXT416((uint)fVar23);
                  sVar12 = sVar12 + 1;
                } while (local_128.fixed[0]._M_string_length != sVar12);
              }
              auVar24 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,local_128.fixed[0]._M_string_length);
              auVar24._0_4_ = auVar20._0_4_ / auVar24._0_4_;
              auVar24._4_12_ = auVar20._4_12_;
              auVar20._8_4_ = 0x7fffffff;
              auVar20._0_8_ = 0x7fffffff7fffffff;
              auVar20._12_4_ = 0x7fffffff;
              auVar20 = vandps_avx512vl(auVar24,auVar20);
              auVar20 = vmaxss_avx(auVar20,ZEXT416((uint)local_594));
              local_594 = auVar20._0_4_;
              local_128.fixed[0]._M_string_length = 0;
              (**(code **)(*local_148 + 0x18))
                        (local_148,local_140,(long)local_128.fixed[0]._M_dataplus._M_p << 2,4);
              uVar15 = uVar15 + 1;
              pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_360._0_8_;
            } while ((long)uVar15 < (long)(int)local_360._4_4_);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < (int)local_360._8_4_);
      }
      local_360._4_4_ = (undefined4)((ulong)pIVar4 >> 0x20);
      PVar18.super_Tuple2<pbrt::Point2,_int>.y = local_360._8_4_;
      PVar18.super_Tuple2<pbrt::Point2,_int>.x = local_360._4_4_;
      local_478 = (undefined1  [8])&aStack_468;
      local_360._0_8_ = pIVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"R","");
      asStack_458._0_8_ = auStack_448;
      std::__cxx11::string::_M_construct<char_const*>(asStack_458,"G","");
      plVar17 = alStack_428;
      local_438 = (string  [8])plVar17;
      std::__cxx11::string::_M_construct<char_const*>(local_438,"B","");
      local_370.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )0;
      AVar8.memoryResource = pstd::pmr::new_delete_resource();
      channels.n = 3;
      channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478;
      pbrt::Image::Image((Image *)&local_148,Half,PVar18,channels,&local_370,AVar8);
      lVar16 = -0x60;
      do {
        if (plVar17 != (long *)plVar17[-2]) {
          operator_delete((long *)plVar17[-2],*plVar17 + 1);
        }
        plVar17 = plVar17 + -4;
        lVar16 = lVar16 + 0x20;
      } while (lVar16 != 0);
      if (0 < (int)local_360._8_4_) {
        local_550 = 0;
        pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_360._0_8_;
        do {
          local_360._4_4_ = (undefined4)((ulong)pIVar4 >> 0x20);
          bVar5 = 0 < (int)local_360._4_4_;
          local_360._0_8_ = pIVar4;
          if (bVar5) {
            uVar15 = local_550 << 0x20;
            uVar19 = 0;
            do {
              PVar18.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(uVar15 | uVar19);
              pbrt::Image::GetChannels
                        ((ImageChannelValues *)local_478,(Image *)local_360,PVar18,
                         (WrapMode2D)0x200000002);
              if (asStack_458._8_8_ == 0) {
                auVar20 = SUB6416(ZEXT864(0),0);
              }
              else {
                afVar10 = afStack_470;
                if (afStack_470 == (float  [2])0x0) {
                  afVar10 = (float  [2])&aStack_468;
                }
                fVar23 = 0.0;
                sVar13 = 0;
                do {
                  fVar23 = fVar23 + *(float *)((long)afVar10 + sVar13 * 4);
                  auVar20 = ZEXT416((uint)fVar23);
                  sVar13 = sVar13 + 1;
                } while (asStack_458._8_8_ != sVar13);
              }
              auVar24 = vcvtusi2ss_avx512f(in_XMM3,asStack_458._8_8_);
              local_588._4_12_ = auVar20._4_12_;
              local_588._0_4_ = (auVar20._0_4_ / auVar24._0_4_) / local_594;
              asStack_458[8] = (string)0x0;
              asStack_458[9] = (string)0x0;
              asStack_458[10] = (string)0x0;
              asStack_458[0xb] = (string)0x0;
              asStack_458[0xc] = (string)0x0;
              asStack_458[0xd] = (string)0x0;
              asStack_458[0xe] = (string)0x0;
              asStack_458[0xf] = (string)0x0;
              (**(code **)(*(size_type *)local_478 + 0x18))
                        (local_478,afStack_470,asStack_458._0_8_ << 2,4);
              if (local_595 == true) {
                FVar21 = 0.0;
                auVar20 = local_588;
                if (local_588._0_4_ <= 0.0) {
                  auVar2._8_4_ = 0x7fffffff;
                  auVar2._0_8_ = 0x7fffffff7fffffff;
                  auVar2._12_4_ = 0x7fffffff;
                  auVar20 = vandps_avx512vl(local_588,auVar2);
                  FVar21 = auVar20._0_4_;
                  auVar20 = ZEXT816(0) << 0x20;
                }
                auVar26 = ZEXT1664(auVar20);
                local_4e8 = ZEXT816(0);
              }
              else {
                auVar20 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),local_588);
                auVar25._0_12_ = ZEXT812(0);
                auVar25._12_4_ = 0;
                uVar1 = vcmpss_avx512f(local_588,auVar25,1);
                lVar16 = ((long)falseColorValues.
                                super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)falseColorValues.
                                super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
                                super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
                auVar24 = vcvtusi2ss_avx512f(in_XMM3,lVar16);
                iVar11 = (int)((float)((uint)!(bool)((byte)uVar1 & 1) * auVar20._0_4_) *
                              auVar24._0_4_);
                iVar7 = (int)lVar16 + -1;
                if (iVar11 <= iVar7) {
                  iVar7 = iVar11;
                }
                FVar21 = falseColorValues.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>.
                         _M_impl.super__Vector_impl_data._M_start[iVar7].r;
                auVar26 = ZEXT464((uint)falseColorValues.
                                        super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>.
                                        _M_impl.super__Vector_impl_data._M_start[iVar7].g);
                local_4e8 = ZEXT416((uint)falseColorValues.
                                          super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>.
                                          _M_impl.super__Vector_impl_data._M_start[iVar7].b);
              }
              if (FVar21 <= 0.04045) {
                aVar22 = (aligned_storage_t<sizeof(float),_alignof(float)>)(FVar21 * 0.07739938);
              }
              else {
                local_588 = auVar26._0_16_;
                aVar22 = (aligned_storage_t<sizeof(float),_alignof(float)>)
                         powf((FVar21 + 0.055) * 0.94786733,2.4);
                auVar26 = ZEXT1664(local_588);
              }
              local_478._0_4_ = aVar22;
              fVar23 = auVar26._0_4_;
              if (fVar23 <= 0.04045) {
                fVar23 = fVar23 * 0.07739938;
              }
              else {
                fVar23 = powf((fVar23 + 0.055) * 0.94786733,2.4);
              }
              local_478._4_4_ = fVar23;
              if ((float)local_4e8._0_4_ <= 0.04045) {
                fVar23 = (float)local_4e8._0_4_ * 0.07739938;
              }
              else {
                fVar23 = powf(((float)local_4e8._0_4_ + 0.055) * 0.94786733,2.4);
              }
              afStack_470[0] = fVar23;
              values.n = 3;
              values.ptr = (float *)local_478;
              pbrt::Image::SetChannels((Image *)&local_148,PVar18,values);
              uVar19 = uVar19 + 1;
            } while ((long)uVar19 < (long)(int)local_360._4_4_);
          }
          local_550 = local_550 + 1;
          pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_360._0_8_;
        } while (local_550 < (int)local_360._8_4_);
      }
      _Stack_3a8._M_impl.super__Rb_tree_header._M_header._M_left =
           &_Stack_3a8._M_impl.super__Rb_tree_header._M_header;
      local_3b8 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                   )0x0;
      uStack_3b0 = 0;
      _Stack_3a8._M_impl._0_8_ = 0;
      _Stack_3a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      _Stack_3a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      _Stack_3a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      alStack_428[6] = 0;
      auStack_3f0 = (undefined1  [8])0x0;
      aStack_3e8._0_8_ = 0;
      aStack_3e8._8_8_ = 0;
      uStack_3d8 = 0;
      auStack_3d0 = (undefined1  [8])0x0;
      oStack_3c8.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
      oStack_3c8.set = false;
      oStack_3c8._5_3_ = 0;
      oStack_3c0.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      oStack_3c0.set = false;
      oStack_3c0._5_3_ = 0;
      local_438[0] = (string)0x0;
      local_438[1] = (string)0x0;
      local_438[2] = (string)0x0;
      local_438[3] = (string)0x0;
      local_438[4] = (string)0x0;
      local_438[5] = (string)0x0;
      local_438[6] = (string)0x0;
      local_438[7] = (string)0x0;
      uStack_430 = 0;
      alStack_428[0] = 0;
      alStack_428[1] = 0;
      alStack_428[2] = 0;
      alStack_428[3] = 0;
      alStack_428[4] = 0;
      alStack_428[5] = 0;
      local_478._0_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      local_478[4] = false;
      local_478._5_3_ = 0;
      afStack_470 = (float  [2])0x0;
      aStack_468._M_allocated_capacity = 0;
      aStack_468._8_8_ = 0;
      asStack_458[0] = (string)0x0;
      asStack_458[1] = (string)0x0;
      asStack_458[2] = (string)0x0;
      asStack_458[3] = (string)0x0;
      asStack_458[4] = (string)0x0;
      asStack_458[5] = (string)0x0;
      asStack_458[6] = (string)0x0;
      asStack_458[7] = (string)0x0;
      asStack_458[8] = (string)0x0;
      asStack_458[9] = (string)0x0;
      asStack_458[10] = (string)0x0;
      asStack_458[0xb] = (string)0x0;
      asStack_458[0xc] = (string)0x0;
      asStack_458[0xd] = (string)0x0;
      asStack_458[0xe] = (string)0x0;
      asStack_458[0xf] = (string)0x0;
      auStack_448[0] = 0;
      auStack_448[1] = 0;
      _Stack_3a8._M_impl.super__Rb_tree_header._M_node_count = 0;
      _Stack_3a8._M_impl.super__Rb_tree_header._M_header._M_right =
           _Stack_3a8._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar5 = pbrt::Image::Write((Image *)&local_148,&local_570,(ImageMetadata *)local_478);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&_Stack_3a8);
      if (uStack_3b0._0_1_ == true) {
        uStack_3b0 = uStack_3b0 & 0xffffffffffffff00;
      }
      if (oStack_3c0.set == true) {
        oStack_3c0.set = false;
      }
      if (oStack_3c8.set == true) {
        oStack_3c8.set = false;
      }
      if ((bool)auStack_3d0[4] == true) {
        auStack_3d0[4] = 0;
      }
      if (uStack_3d8._0_1_ == true) {
        uStack_3d8 = uStack_3d8 & 0xffffffffffffff00;
      }
      if ((bool)auStack_3f0[4] == true) {
        auStack_3f0[4] = 0;
      }
      if (uStack_430._0_1_ == true) {
        uStack_430 = uStack_430 & 0xffffffffffffff00;
      }
      if ((bool)local_478[4] == true) {
        local_478[4] = 0;
      }
      local_38 = 0;
      (*(local_50.memoryResource)->_vptr_memory_resource[3])
                (local_50.memoryResource,local_48,local_40 << 2,4);
      local_58 = 0;
      (*(local_70.memoryResource)->_vptr_memory_resource[3])
                (local_70.memoryResource,local_68,local_60 * 2,2);
      local_78 = 0;
      (*(local_90.memoryResource)->_vptr_memory_resource[3])
                (local_90.memoryResource,local_88,local_80,1);
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&stack0xfffffffffffffec8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_178);
      if (local_180 == true) {
        local_180 = false;
      }
      if (local_18c == true) {
        local_18c = false;
      }
      if (local_194 == true) {
        local_194 = false;
      }
      if (local_19c == true) {
        local_19c = false;
      }
      if (local_1a8 == true) {
        local_1a8 = false;
      }
      if (local_1bc == true) {
        local_1bc = false;
      }
      if (local_200 == true) {
        local_200 = false;
      }
      if (local_244 == true) {
        local_244 = false;
      }
      local_250 = 0;
      (*(local_268.memoryResource)->_vptr_memory_resource[3])
                (local_268.memoryResource,local_260,local_258 << 2,4);
      local_270 = 0;
      (*(local_288.memoryResource)->_vptr_memory_resource[3])
                (local_288.memoryResource,local_280,local_278 * 2,2);
      local_290 = 0;
      (*(local_2a8.memoryResource)->_vptr_memory_resource[3])
                (local_2a8.memoryResource,local_2a0,local_298,1);
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector(&local_350);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548._M_dataplus._M_p != &local_548.field_2) {
        operator_delete(local_548._M_dataplus._M_p,
                        CONCAT71(local_548.field_2._M_allocated_capacity._1_7_,
                                 local_548.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570._M_dataplus._M_p != &local_570.field_2) {
        operator_delete(local_570._M_dataplus._M_p,
                        CONCAT71(local_570.field_2._M_allocated_capacity._1_7_,
                                 local_570.field_2._M_local_buf[0]) + 1);
      }
      return (int)!bVar5;
    }
    pcVar14 = "expecting --outfile filename.";
  }
  usage("falsecolor",pcVar14);
}

Assistant:

int falsecolor(int argc, char *argv[]) {
    std::string outFile, inFile;
    bool plusMinus = false;
    Float maxValue = -Infinity;

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("falsecolor", "%s", err.c_str());
            exit(1);
        };

        if (ParseArg(&argv, "outfile", &outFile, onError) ||
            ParseArg(&argv, "plusminus", &plusMinus, onError) ||
            ParseArg(&argv, "maxValue", &maxValue, onError)) {
            // success
        } else if (inFile.empty() && argv[0][0] != '-') {
            inFile = *argv;
            ++argv;
        } else {
            usage("falsecolor", "%s: unknown command flag", *argv);
        }
    }

    if (inFile.empty())
        usage("falsecolor", "expecting input image filename.");
    if (outFile.empty())
        usage("falsecolor", "expecting --outfile filename.");

    ImageAndMetadata im = Image::Read(inFile);
    const Image &image = im.image;

    if (maxValue == -Infinity)
        for (int y = 0; y < image.Resolution().y; ++y)
            for (int x = 0; x < image.Resolution().x; ++x)
                maxValue =
                    std::max(maxValue, std::abs(image.GetChannels({x, y}).Average()));

    Image outImage(PixelFormat::Half, image.Resolution(), {"R", "G", "B"});
    for (int y = 0; y < image.Resolution().y; ++y)
        for (int x = 0; x < image.Resolution().x; ++x) {
            Float relativeValue = image.GetChannels({x, y}).Average() / maxValue;
            RGB rgb;
            if (plusMinus) {
                if (relativeValue > 0)
                    rgb = RGB(0, relativeValue, 0);
                else
                    rgb = RGB(std::abs(relativeValue), 0, 0);
            } else {
                relativeValue = Clamp(relativeValue, 0, 1);
                int index = relativeValue * falseColorValues.size();
                index = std::min<int>(index, falseColorValues.size() - 1);
                rgb = falseColorValues[index];
            }

            outImage.SetChannels({x, y}, {SRGBToLinear(rgb[0]), SRGBToLinear(rgb[1]),
                                          SRGBToLinear(rgb[2])});
        }

    if (!outImage.Write(outFile))
        return 1;

    return 0;
}